

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

int TPZShapeHDivConstantBound<pzshape::TPZShapeLinear>::NShape(TPZShapeData *data)

{
  int iVar1;
  
  iVar1 = 1;
  if (*(data->fH1ConnectOrders).super_TPZVec<int>.fStore != 0) {
    iVar1 = (int)(data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                 fRow;
  }
  return iVar1;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}